

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O1

QHttpNetworkReply * __thiscall
QHttpNetworkConnectionPrivate::queueRequest
          (QHttpNetworkConnectionPrivate *this,QHttpNetworkRequest *request)

{
  QObject *pQVar1;
  long lVar2;
  int *piVar3;
  QHttpNetworkConnectionChannel *pQVar4;
  bool bVar5;
  Priority PVar6;
  QHttpNetworkReply *this_00;
  undefined8 uVar7;
  QGenericArrayOps<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *this_01;
  long in_FS_OFFSET;
  Priority local_5c;
  HttpMessagePair local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  this_00 = (QHttpNetworkReply *)operator_new(0x18);
  (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[2])(&local_58,request);
  uVar7 = 0;
  QHttpNetworkReply::QHttpNetworkReply
            ((QHttpNetworkReply *)this_00,(QUrl *)&local_58,(QObject *)0x0);
  QUrl::~QUrl((QUrl *)&local_58);
  QHttpNetworkReply::setRequest((QHttpNetworkReply *)this_00,request);
  lVar2 = *(long *)&this_00->field_0x8;
  if (pQVar1 != (QObject *)0x0) {
    uVar7 = QtSharedPointer::ExternalRefCountData::getAndRef(pQVar1);
  }
  piVar3 = *(int **)(lVar2 + 0x168);
  *(undefined8 *)(lVar2 + 0x168) = uVar7;
  *(QObject **)(lVar2 + 0x170) = pQVar1;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3);
    }
  }
  pQVar4 = this->channels;
  lVar2 = *(long *)&this_00->field_0x8;
  if (pQVar4 == (QHttpNetworkConnectionChannel *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar4->super_QObject);
  }
  piVar3 = *(int **)(lVar2 + 0x178);
  *(undefined8 *)(lVar2 + 0x178) = uVar7;
  *(QHttpNetworkConnectionChannel **)(lVar2 + 0x180) = pQVar4;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      operator_delete(piVar3);
    }
  }
  local_58.second = (QHttpNetworkReply *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_58.first.d.d.ptr =
       (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
  QHttpNetworkRequest::QHttpNetworkRequest(&local_58.first,request);
  local_58.second = this_00;
  bVar5 = QHttpNetworkRequest::isPreConnect(request);
  if (bVar5) {
    this->preConnectRequests = this->preConnectRequests + 1;
  }
  if ((this->connectionType == ConnectionTypeHTTP) ||
     (((this->connectionType == ConnectionTypeHTTP2 && (this->encrypt == false)) &&
      (this->channels->switchedToHttp2 == false)))) {
    PVar6 = QHttpNetworkRequest::priority(request);
    if (PVar6 - NormalPriority < 2) {
      this_01 = (QGenericArrayOps<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *)
                &this->lowPriorityQueue;
    }
    else {
      if (PVar6 != HighPriority) goto LAB_0020373e;
      this_01 = (QGenericArrayOps<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>> *)
                &this->highPriorityQueue;
    }
    QtPrivate::QGenericArrayOps<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>>::
    emplace<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>const&>(this_01,0,&local_58);
  }
  else {
    if (*(char *)(*(long *)&(local_58.second)->field_0x8 + 0x1b8) == '\0') {
      prepareRequest(this,&local_58);
    }
    pQVar4 = this->channels;
    local_5c = QHttpNetworkRequest::priority(request);
    QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::insert
              (&pQVar4->h2RequestsToSend,(int *)&local_5c,&local_58);
  }
LAB_0020373e:
  if (this->networkLayerState - IPv4 < 2) {
    _q_startNextRequest(this);
  }
  else if (this->networkLayerState < IPv4) {
    startHostInfoLookup(this);
  }
  QHttpNetworkRequest::~QHttpNetworkRequest(&local_58.first);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

QHttpNetworkReply* QHttpNetworkConnectionPrivate::queueRequest(const QHttpNetworkRequest &request)
{
    Q_Q(QHttpNetworkConnection);

    // The reply component of the pair is created initially.
    QHttpNetworkReply *reply = new QHttpNetworkReply(request.url());
    reply->setRequest(request);
    reply->d_func()->connection = q;
    reply->d_func()->connectionChannel = &channels[0]; // will have the correct one set later
    HttpMessagePair pair = std::pair(request, reply);

    if (request.isPreConnect())
        preConnectRequests++;

    if (connectionType == QHttpNetworkConnection::ConnectionTypeHTTP
        || (!encrypt && connectionType == QHttpNetworkConnection::ConnectionTypeHTTP2 && !channels[0].switchedToHttp2)) {
        switch (request.priority()) {
        case QHttpNetworkRequest::HighPriority:
            highPriorityQueue.prepend(pair);
            break;
        case QHttpNetworkRequest::NormalPriority:
        case QHttpNetworkRequest::LowPriority:
            lowPriorityQueue.prepend(pair);
            break;
        }
    }
    else { // HTTP/2 ('h2' mode)
        if (!pair.second->d_func()->requestIsPrepared)
            prepareRequest(pair);
        channels[0].h2RequestsToSend.insert(request.priority(), pair);
    }

    // For Happy Eyeballs the networkLayerState is set to Unknown
    // until we have started the first connection attempt. So no
    // request will be started until we know if IPv4 or IPv6
    // should be used.
    if (networkLayerState == Unknown || networkLayerState == HostLookupPending) {
        startHostInfoLookup();
    } else if ( networkLayerState == IPv4 || networkLayerState == IPv6 ) {
        // this used to be called via invokeMethod and a QueuedConnection
        // It is the only place _q_startNextRequest is called directly without going
        // through the event loop using a QueuedConnection.
        // This is dangerous because of recursion that might occur when emitting
        // signals as DirectConnection from this code path. Therefore all signal
        // emissions that can come out from this code path need to
        // be QueuedConnection.
        // We are currently trying to fine-tune this.
        _q_startNextRequest();
    }
    return reply;
}